

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# witness.c
# Opt level: O3

void witness_print_witnesses(witness_list_t *witnesses)

{
  witness_t *pwVar1;
  witness_t *pwVar2;
  witness_t *w;
  uint n;
  witness_t *w_00;
  
  pwVar2 = witnesses->qlh_first;
  if (pwVar2 != (witness_t *)0x0) {
    n = 0;
    pwVar1 = pwVar2;
    w_00 = (witness_t *)0x0;
    do {
      w = pwVar1;
      if ((w_00 == (witness_t *)0x0) || (w->rank <= w_00->rank)) {
        n = n + 1;
      }
      else {
        witness_print_witness(w_00,n);
        pwVar2 = witnesses->qlh_first;
        n = 1;
      }
      pwVar1 = (w->link).qre_next;
    } while ((pwVar1 != pwVar2) && (w_00 = w, pwVar1 != (witness_t *)0x0));
    witness_print_witness(w,n);
    return;
  }
  return;
}

Assistant:

static void
witness_print_witnesses(const witness_list_t *witnesses) {
	witness_t *w, *last = NULL;
	unsigned n = 0;
	ql_foreach(w, witnesses, link) {
		if (last != NULL && w->rank > last->rank) {
			assert(w->name != last->name);
			witness_print_witness(last, n);
			n = 0;
		} else if (last != NULL) {
			assert(w->rank == last->rank);
			assert(w->name == last->name);
		}
		last = w;
		++n;
	}
	if (last != NULL) {
		witness_print_witness(last, n);
	}
}